

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O2

void __thiscall spirv_cross::CFG::add_branch(CFG *this,uint32_t from,uint32_t to)

{
  mapped_type *pmVar1;
  uint32_t value;
  uint32_t value_00;
  undefined8 local_28;
  
  local_28 = CONCAT44(from,to);
  pmVar1 = ::std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->preceding_edges,(key_type *)&local_28);
  add_branch::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)pmVar1,(SmallVector<unsigned_int,_8UL> *)(ulong)from,value);
  pmVar1 = ::std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->succeeding_edges,(key_type *)((long)&local_28 + 4));
  add_branch::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)pmVar1,
             (SmallVector<unsigned_int,_8UL> *)(local_28 & 0xffffffff),value_00);
  return;
}

Assistant:

void CFG::add_branch(uint32_t from, uint32_t to)
{
	const auto add_unique = [](SmallVector<uint32_t> &l, uint32_t value) {
		auto itr = find(begin(l), end(l), value);
		if (itr == end(l))
			l.push_back(value);
	};
	add_unique(preceding_edges[to], from);
	add_unique(succeeding_edges[from], to);
}